

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.h
# Opt level: O2

void * region_reserve(region *region,size_t size)

{
  rlist *prVar1;
  void *pvVar2;
  
  if (region->reserved != 0) {
    __assert_fail("!region->reserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                  ,0xda,"void *region_reserve(struct region *, size_t)");
  }
  prVar1 = (region->slabs).slabs.next;
  if ((((slab_list *)prVar1 == &region->slabs) && (prVar1 == (region->slabs).slabs.prev)) ||
     ((*(int *)&prVar1[1].prev - *(uint *)&prVar1[2].prev) - 0x38 < size)) {
    pvVar2 = region_reserve_slow(region,size);
    if (pvVar2 == (void *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    pvVar2 = (void *)((long)&prVar1[2].next + (ulong)*(uint *)&prVar1[2].prev);
  }
  region->reserved = 1;
  return pvVar2;
}

Assistant:

static inline void *
region_reserve(struct region *region, size_t size)
{
	void *ptr = NULL;
	assert(!region->reserved);
	if (! rlist_empty(&region->slabs.slabs)) {
		struct rslab *slab = rlist_first_entry(&region->slabs.slabs,
						       struct rslab,
						       slab.next_in_list);
		if (size <= rslab_unused(slab))
			ptr = (char *) rslab_data(slab) + slab->used;
	}
	if (ptr == NULL)
		ptr = region_reserve_slow(region, size);
#ifndef NDEBUG
	if (ptr != NULL)
		region->reserved = true;
#endif
	return ptr;
}